

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaFixupSimpleTypeStageTwo(xmlSchemaParserCtxtPtr pctxt,xmlSchemaTypePtr type)

{
  xmlSchemaTypeLinkPtr *ppxVar1;
  int iVar2;
  xmlSchemaTypeType xVar3;
  uint uVar4;
  int iVar5;
  _xmlSchemaTypeLink *p_Var6;
  xmlChar *pxVar7;
  xmlSchemaTypeLinkPtr pxVar8;
  xmlChar *pxVar9;
  xmlChar *pxVar10;
  xmlParserErrors xVar11;
  char *funcName;
  xmlSchemaTypePtr pxVar12;
  xmlSchemaFacetPtr in_R8;
  char *pcVar13;
  xmlSchemaTypePtr pxVar14;
  _xmlSchemaTypeLink *p_Var15;
  bool bVar16;
  _xmlSchemaTypeLink *p_Var17;
  xmlSchemaFacetPtr facet;
  xmlSchemaTypeLinkPtr pxVar18;
  xmlSchemaFacetPtr pxVar19;
  xmlChar *local_48;
  xmlChar *local_40;
  xmlChar *local_38;
  
  if (type->type != XML_SCHEMA_TYPE_SIMPLE) {
    return -1;
  }
  if (((uint)type->flags >> 0x16 & 1) != 0) {
    return 0;
  }
  iVar2 = pctxt->nberrors;
  type->flags = type->flags | 0x400000;
  type->contentType = XML_SCHEMA_CONTENT_SIMPLE;
  pxVar12 = type->baseType;
  if (pxVar12 == (xmlSchemaTypePtr)0x0) {
    funcName = "xmlSchemaFixupSimpleTypeStageTwo";
    pcVar13 = "missing baseType";
LAB_0019c422:
    xmlSchemaInternalErr2
              ((xmlSchemaAbstractCtxtPtr)pctxt,funcName,pcVar13,(xmlChar *)0x0,(xmlChar *)in_R8);
    return -1;
  }
  if ((pxVar12->type != XML_SCHEMA_TYPE_BASIC) && ((pxVar12->flags & 0x400000) == 0)) {
    xmlSchemaTypeFixup(pxVar12,(xmlSchemaAbstractCtxtPtr)pctxt);
  }
  for (pxVar8 = type->memberTypes; pxVar8 != (xmlSchemaTypeLinkPtr)0x0; pxVar8 = pxVar8->next) {
    pxVar12 = pxVar8->type;
    if ((pxVar12->type != XML_SCHEMA_TYPE_BASIC) && ((pxVar12->flags & 0x400000) == 0)) {
      xmlSchemaTypeFixup(pxVar12,(xmlSchemaAbstractCtxtPtr)pctxt);
      pxVar12 = pxVar8->type;
    }
    if ((pxVar12->flags & 0x80) != 0) {
      do {
        if (pxVar12->type != XML_SCHEMA_TYPE_SIMPLE) break;
        pxVar18 = pxVar12->memberTypes;
        if (pxVar18 != (xmlSchemaTypeLinkPtr)0x0) {
          pxVar8->type = pxVar18->type;
          p_Var17 = pxVar18->next;
          if (p_Var17 != (_xmlSchemaTypeLink *)0x0) {
            p_Var15 = pxVar8->next;
            pxVar18 = pxVar8;
            do {
              p_Var6 = (_xmlSchemaTypeLink *)(*xmlMalloc)(0x10);
              if (p_Var6 == (_xmlSchemaTypeLink *)0x0) {
                xmlSchemaPErrMemory(pctxt);
                return -1;
              }
              p_Var6->type = p_Var17->type;
              pxVar18->next = p_Var6;
              p_Var6->next = p_Var15;
              p_Var17 = p_Var17->next;
              pxVar18 = p_Var6;
            } while (p_Var17 != (_xmlSchemaTypeLink *)0x0);
          }
          break;
        }
        pxVar12 = pxVar12->baseType;
      } while (pxVar12 != (xmlSchemaTypePtr)0x0);
    }
  }
  pxVar12 = type->baseType;
  local_48 = (xmlChar *)0x0;
  if (pxVar12 == (xmlSchemaTypePtr)0x0) {
    xmlSchemaPCustomErrExt
              (pctxt,XML_SCHEMAP_ST_PROPS_CORRECT_1,(xmlSchemaBasicItemPtr)type,(xmlNodePtr)0x0,
               "No base type existent",(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
    goto LAB_0019c46c;
  }
  xVar3 = pxVar12->type;
  if ((xVar3 == XML_SCHEMA_TYPE_SIMPLE) ||
     ((xVar3 == XML_SCHEMA_TYPE_BASIC && (pxVar12->builtInType != 0x2d)))) {
    uVar4 = type->flags;
    if (((char)((uVar4 & 4) >> 2) == '\0' && (uVar4 & 0xc0) != 0) &&
       ((xVar3 != XML_SCHEMA_TYPE_SIMPLE &&
        ((xVar3 != XML_SCHEMA_TYPE_BASIC || (pxVar12->builtInType != 0x2e)))))) {
      pxVar7 = xmlSchemaGetComponentQName(&local_48,pxVar12);
      pcVar13 = 
      "A type, derived by list or union, must have the simple ur-type definition as base type, not \'%s\'"
      ;
      goto LAB_0019c3e7;
    }
    if ((uVar4 & 0x1c0) == 0) {
      pcVar13 = "The variety is absent";
      xVar11 = XML_SCHEMAP_ST_PROPS_CORRECT_1;
      goto LAB_0019c589;
    }
    if (((uint)pxVar12->flags >> 10 & 1) != 0) {
      pxVar7 = xmlSchemaGetComponentQName(&local_48,pxVar12);
      pcVar13 = "The \'final\' of its base type \'%s\' must not contain \'restriction\'";
      xVar11 = XML_SCHEMAP_ST_PROPS_CORRECT_3;
      goto LAB_0019c3ef;
    }
    local_48 = (xmlChar *)0x0;
    if (type->type != XML_SCHEMA_TYPE_SIMPLE) {
      funcName = "xmlSchemaCheckCOSSTRestricts";
      pcVar13 = "given type is not a user-derived simpleType";
      goto LAB_0019c422;
    }
    if ((uVar4 >> 8 & 1) != 0) {
      if (((uint)pxVar12->flags >> 8 & 1) != 0) {
        pxVar12 = (xmlSchemaTypePtr)type->facets;
        if (pxVar12 != (xmlSchemaTypePtr)0x0) {
          pcVar13 = "failed to get primitive type";
          pxVar14 = type;
          do {
            if ((pxVar14->builtInType == 0x2e) || ((pxVar14->flags & 0x4000) != 0)) {
              bVar16 = false;
              goto LAB_0019c6a1;
            }
            pxVar14 = pxVar14->baseType;
          } while (pxVar14 != (xmlSchemaTypePtr)0x0);
          goto LAB_0019c688;
        }
        goto LAB_0019c6e7;
      }
      pxVar7 = xmlSchemaGetComponentQName(&local_48,pxVar12);
      pcVar13 = "The base type \'%s\' is not an atomic simple type";
      xVar11 = XML_SCHEMAP_COS_ST_RESTRICTS_1_1;
      goto LAB_0019c3ef;
    }
    if ((uVar4 & 0x40) == 0) {
      if (-1 < (char)uVar4) goto LAB_0019c6e7;
      ppxVar1 = &type->memberTypes;
      pxVar8 = (xmlSchemaTypeLinkPtr)ppxVar1;
      do {
        pxVar8 = pxVar8->next;
        if (pxVar8 == (xmlSchemaTypeLinkPtr)0x0) {
          pxVar12 = type->baseType;
          if (pxVar12->builtInType == 0x2e) {
            pxVar8 = *ppxVar1;
            goto LAB_0019c777;
          }
          if (-1 < (char)pxVar12->flags) {
            pxVar7 = xmlSchemaGetComponentQName(&local_48,pxVar12);
            pcVar13 = "The base type \'%s\' is not a union type";
            xVar11 = XML_SCHEMAP_COS_ST_RESTRICTS_3_3_2_1;
            goto LAB_0019c3ef;
          }
          if (((uint)pxVar12->flags >> 10 & 1) == 0) {
            p_Var17 = *ppxVar1;
            if (p_Var17 != (xmlSchemaTypeLinkPtr)0x0) goto LAB_0019c93c;
            goto LAB_0019c9b2;
          }
          pxVar7 = xmlSchemaGetComponentQName(&local_48,pxVar12);
          pcVar13 = "The \'final\' of its base type \'%s\' must not contain \'restriction\'";
          xVar11 = XML_SCHEMAP_COS_ST_RESTRICTS_3_3_2_2;
          goto LAB_0019cb5e;
        }
        pxVar12 = pxVar8->type;
        if ((pxVar12->type != XML_SCHEMA_TYPE_BASIC) && ((pxVar12->flags & 0x400000) == 0)) {
          xmlSchemaTypeFixup(pxVar12,(xmlSchemaAbstractCtxtPtr)pctxt);
          pxVar12 = pxVar8->type;
        }
      } while ((pxVar12->flags & 0x140) != 0);
      pxVar7 = xmlSchemaGetComponentQName(&local_48,pxVar12);
      pcVar13 = "The member type \'%s\' is neither an atomic, nor a list type";
      xVar11 = XML_SCHEMAP_COS_ST_RESTRICTS_3_1;
      goto LAB_0019c3ef;
    }
    pxVar12 = type->subtypes;
    pcVar13 = "failed to evaluate the item type";
    if (pxVar12 == (xmlSchemaTypePtr)0x0) {
LAB_0019c688:
      xmlSchemaInternalErr2
                ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaCheckCOSSTRestricts",pcVar13,
                 (xmlChar *)0x0,(xmlChar *)in_R8);
      return -1;
    }
    if (pxVar12->type == XML_SCHEMA_TYPE_SIMPLE) {
      if ((pxVar12->flags & 0x400000) == 0) {
        xmlSchemaTypeFixup(pxVar12,(xmlSchemaAbstractCtxtPtr)pctxt);
      }
    }
    else if ((pxVar12->type != XML_SCHEMA_TYPE_BASIC) || (pxVar12->builtInType == 0x2d))
    goto LAB_0019c688;
    uVar4 = pxVar12->flags;
    if ((uVar4 & 0x180) == 0) {
      pxVar7 = xmlSchemaGetComponentQName(&local_48,pxVar12);
      xmlSchemaPCustomErrExt
                (pctxt,XML_SCHEMAP_COS_ST_RESTRICTS_2_1,(xmlSchemaBasicItemPtr)type,(xmlNodePtr)0x0,
                 "The item type \'%s\' does not have a variety of atomic or union",pxVar7,
                 (xmlChar *)0x0,(xmlChar *)0x0);
    }
    else {
      if ((char)uVar4 < '\0') {
        pxVar8 = (xmlSchemaTypeLinkPtr)&pxVar12->memberTypes;
        do {
          pxVar8 = pxVar8->next;
          if (pxVar8 == (xmlSchemaTypeLinkPtr)0x0) goto LAB_0019c7c1;
        } while ((pxVar8->type->flags & 0x100) != 0);
        pxVar7 = xmlSchemaGetComponentQName(&local_48,pxVar8->type);
        pcVar13 = 
        "The item type is a union type, but the member type \'%s\' of this item type is not atomic";
        xVar11 = XML_SCHEMAP_COS_ST_RESTRICTS_2_1;
        goto LAB_0019c3ef;
      }
LAB_0019c7c1:
      pxVar14 = type->baseType;
      if ((pxVar14->type == XML_SCHEMA_TYPE_BASIC) && (pxVar14->builtInType == 0x2e)) {
        if ((uVar4 >> 0xb & 1) == 0) {
          for (pxVar19 = type->facets; pxVar19 != (xmlSchemaFacetPtr)0x0; pxVar19 = pxVar19->next) {
            if (pxVar19->type != XML_SCHEMA_FACET_WHITESPACE) {
              xmlSchemaPIllegalFacetListUnionErr
                        (pctxt,XML_SCHEMAP_COS_ST_RESTRICTS_2_3_1_2,type,pxVar19);
              goto LAB_0019c46c;
            }
          }
          goto LAB_0019c6e7;
        }
        pxVar7 = xmlSchemaGetComponentQName(&local_48,pxVar12);
        xmlSchemaPCustomErrExt
                  (pctxt,XML_SCHEMAP_COS_ST_RESTRICTS_2_3_1_1,(xmlSchemaBasicItemPtr)type,
                   (xmlNodePtr)0x0,"The final of its item type \'%s\' must not contain \'list\'",
                   pxVar7,(xmlChar *)0x0,(xmlChar *)0x0);
      }
      else {
        if ((pxVar14->flags & 0x40U) == 0) {
          pxVar7 = xmlSchemaGetComponentQName(&local_48,pxVar14);
          pcVar13 = "The base type \'%s\' must be a list type";
          xVar11 = XML_SCHEMAP_COS_ST_RESTRICTS_2_3_2_1;
          goto LAB_0019c3ef;
        }
        if (((uint)pxVar14->flags >> 10 & 1) == 0) {
          pxVar14 = pxVar14->subtypes;
          pcVar13 = "failed to eval the item type of a base type";
          if ((pxVar14 == (xmlSchemaTypePtr)0x0) ||
             ((pxVar14->type != XML_SCHEMA_TYPE_SIMPLE &&
              ((pxVar14->type != XML_SCHEMA_TYPE_BASIC || (pxVar14->builtInType == 0x2d))))))
          goto LAB_0019c688;
          if ((pxVar12 != pxVar14) &&
             (iVar5 = xmlSchemaCheckCOSSTDerivedOK
                                ((xmlSchemaAbstractCtxtPtr)pctxt,pxVar12,pxVar14,0), iVar5 != 0)) {
            local_40 = (xmlChar *)0x0;
            local_38 = (xmlChar *)0x0;
            pxVar7 = xmlSchemaGetComponentQName(&local_48,pxVar12);
            pxVar9 = xmlSchemaGetComponentQName(&local_40,pxVar14);
            pxVar10 = xmlSchemaGetComponentQName(&local_38,type->baseType);
            xmlSchemaPCustomErrExt
                      (pctxt,XML_SCHEMAP_COS_ST_RESTRICTS_2_3_2_3,(xmlSchemaBasicItemPtr)type,
                       (xmlNodePtr)0x0,
                       "The item type \'%s\' is not validly derived from the item type \'%s\' of the base type \'%s\'"
                       ,pxVar7,pxVar9,pxVar10);
LAB_0019cc4a:
            if (local_48 != (xmlChar *)0x0) {
              (*xmlFree)(local_48);
            }
            if (local_40 != (xmlChar *)0x0) {
              (*xmlFree)(local_40);
            }
            if (local_38 != (xmlChar *)0x0) {
              (*xmlFree)(local_38);
            }
            goto LAB_0019c46c;
          }
          pxVar19 = type->facets;
          if (pxVar19 != (xmlSchemaFacetPtr)0x0) {
            bVar16 = false;
            do {
              while (pxVar19->type - XML_SCHEMA_FACET_PATTERN < 6) {
                pxVar19 = pxVar19->next;
                if (pxVar19 == (_xmlSchemaFacet *)0x0) goto LAB_0019cce8;
              }
              xmlSchemaPIllegalFacetListUnionErr
                        (pctxt,XML_SCHEMAP_COS_ST_RESTRICTS_2_3_2_4,type,pxVar19);
              pxVar19 = pxVar19->next;
              bVar16 = true;
            } while (pxVar19 != (_xmlSchemaFacet *)0x0);
            goto LAB_0019c46c;
          }
          goto LAB_0019c6e7;
        }
        pxVar7 = xmlSchemaGetComponentQName(&local_48,pxVar14);
        pcVar13 = "The \'final\' of the base type \'%s\' must not contain \'restriction\'";
        xVar11 = XML_SCHEMAP_COS_ST_RESTRICTS_2_3_2_2;
LAB_0019cb5e:
        xmlSchemaPCustomErrExt
                  (pctxt,xVar11,(xmlSchemaBasicItemPtr)type,(xmlNodePtr)0x0,pcVar13,pxVar7,
                   (xmlChar *)0x0,(xmlChar *)0x0);
      }
    }
  }
  else {
    pxVar7 = xmlSchemaGetComponentQName(&local_48,pxVar12);
    pcVar13 = "The base type \'%s\' is not a simple type";
LAB_0019c3e7:
    xVar11 = XML_SCHEMAP_ST_PROPS_CORRECT_1;
LAB_0019c3ef:
    xmlSchemaPCustomErrExt
              (pctxt,xVar11,(xmlSchemaBasicItemPtr)type,(xmlNodePtr)0x0,pcVar13,pxVar7,
               (xmlChar *)0x0,(xmlChar *)0x0);
  }
  if (local_48 != (xmlChar *)0x0) {
    (*xmlFree)(local_48);
  }
  goto LAB_0019c46c;
  while( true ) {
    xmlSchemaPIllegalFacetAtomicErr(pctxt,(xmlParserErrors)type,pxVar14,pxVar12,in_R8);
    pxVar12 = pxVar12->next;
    bVar16 = true;
    if (pxVar12 == (_xmlSchemaType *)0x0) break;
LAB_0019c6a1:
    iVar5 = xmlSchemaIsBuiltInTypeFacet(pxVar14,pxVar12->type);
    if (iVar5 != 0) {
      pxVar12 = pxVar12->next;
      if (pxVar12 == (_xmlSchemaType *)0x0) {
        if (!bVar16) goto LAB_0019c6e7;
        break;
      }
      goto LAB_0019c6a1;
    }
  }
  goto LAB_0019c46c;
LAB_0019c777:
  if (pxVar8 == (xmlSchemaTypeLinkPtr)0x0) goto LAB_0019c8fc;
  pxVar12 = pxVar8->type;
  if ((pxVar12 != (xmlSchemaTypePtr)0x0) && ((pxVar12->flags & 0x1000) != 0)) {
    pxVar7 = xmlSchemaGetComponentQName(&local_48,pxVar12);
    pcVar13 = "The \'final\' of member type \'%s\' contains \'union\'";
    xVar11 = XML_SCHEMAP_COS_ST_RESTRICTS_3_3_1;
    goto LAB_0019c3ef;
  }
  pxVar8 = pxVar8->next;
  goto LAB_0019c777;
LAB_0019c8fc:
  if (type->facetSet != (xmlSchemaFacetLinkPtr)0x0) {
    pcVar13 = "No facets allowed";
    xVar11 = XML_SCHEMAP_COS_ST_RESTRICTS_3_3_1_2;
LAB_0019c589:
    xmlSchemaPCustomErrExt
              (pctxt,xVar11,(xmlSchemaBasicItemPtr)type,(xmlNodePtr)0x0,pcVar13,(xmlChar *)0x0,
               (xmlChar *)0x0,(xmlChar *)0x0);
    goto LAB_0019c46c;
  }
  goto LAB_0019c6e7;
  while( true ) {
    p_Var15 = pxVar12->memberTypes;
    if (p_Var15 != (xmlSchemaTypeLinkPtr)0x0) goto LAB_0019c96c;
    pxVar12 = pxVar12->baseType;
    if (pxVar12 == (xmlSchemaTypePtr)0x0) break;
LAB_0019c93c:
    if (pxVar12->type != XML_SCHEMA_TYPE_SIMPLE) break;
  }
  p_Var15 = (xmlSchemaTypeLinkPtr)0x0;
LAB_0019c96c:
  do {
    if (p_Var15 == (xmlSchemaTypeLinkPtr)0x0) {
      xmlSchemaInternalErr2
                ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaCheckCOSSTRestricts",
                 "different number of member types in base",(xmlChar *)0x0,(xmlChar *)in_R8);
      p_Var15 = (_xmlSchemaTypeLink *)0x0;
    }
    else {
      if ((p_Var17->type != p_Var15->type) &&
         (iVar5 = xmlSchemaCheckCOSSTDerivedOK
                            ((xmlSchemaAbstractCtxtPtr)pctxt,p_Var17->type,p_Var15->type,0),
         iVar5 != 0)) {
        local_40 = (xmlChar *)0x0;
        local_38 = (xmlChar *)0x0;
        pxVar7 = xmlSchemaGetComponentQName(&local_48,p_Var17->type);
        pxVar9 = xmlSchemaGetComponentQName(&local_40,p_Var15->type);
        pxVar10 = xmlSchemaGetComponentQName(&local_38,type->baseType);
        xmlSchemaPCustomErrExt
                  (pctxt,XML_SCHEMAP_COS_ST_RESTRICTS_3_3_2_3,(xmlSchemaBasicItemPtr)type,
                   (xmlNodePtr)0x0,
                   "The member type %s is not validly derived from its corresponding member type %s of the base type %s"
                   ,pxVar7,pxVar9,pxVar10);
        goto LAB_0019cc4a;
      }
      p_Var15 = p_Var15->next;
    }
    p_Var17 = p_Var17->next;
  } while (p_Var17 != (_xmlSchemaTypeLink *)0x0);
LAB_0019c9b2:
  pxVar19 = type->facets;
  if (pxVar19 != (xmlSchemaFacetPtr)0x0) {
    bVar16 = false;
    do {
      while ((pxVar19->type & ~XML_SCHEMA_TYPE_BASIC) != XML_SCHEMA_FACET_PATTERN) {
        xmlSchemaPIllegalFacetListUnionErr(pctxt,XML_SCHEMAP_COS_ST_RESTRICTS_3_3_2_4,type,pxVar19);
        pxVar19 = pxVar19->next;
        bVar16 = true;
        if (pxVar19 == (_xmlSchemaFacet *)0x0) goto LAB_0019c46c;
      }
      pxVar19 = pxVar19->next;
    } while (pxVar19 != (_xmlSchemaFacet *)0x0);
LAB_0019cce8:
    if (bVar16) goto LAB_0019c46c;
  }
LAB_0019c6e7:
  iVar5 = xmlSchemaCheckFacetValues(type,pctxt);
  if (iVar5 == -1) {
    return -1;
  }
  if (iVar5 == 0) {
    if (((type->facetSet != (xmlSchemaFacetLinkPtr)0x0) ||
        (type->baseType->facetSet != (xmlSchemaFacetLinkPtr)0x0)) &&
       (iVar5 = xmlSchemaDeriveAndValidateFacets(pctxt,type), iVar5 == -1)) {
      return -1;
    }
    iVar5 = xmlSchemaTypeFixupWhitespace(type);
    if (iVar5 == -1) {
      return -1;
    }
    if (iVar5 == 0) {
      xmlSchemaTypeFixupOptimFacets(type);
    }
  }
LAB_0019c46c:
  iVar5 = 0;
  if (iVar2 != pctxt->nberrors) {
    iVar5 = pctxt->err;
  }
  return iVar5;
}

Assistant:

static int
xmlSchemaFixupSimpleTypeStageTwo(xmlSchemaParserCtxtPtr pctxt,
				 xmlSchemaTypePtr type)
{
    int res, olderrs = pctxt->nberrors;

    if (type->type != XML_SCHEMA_TYPE_SIMPLE)
	return(-1);

    if (! WXS_IS_TYPE_NOT_FIXED(type))
	return(0);

    type->flags |= XML_SCHEMAS_TYPE_INTERNAL_RESOLVED;
    type->contentType = XML_SCHEMA_CONTENT_SIMPLE;

    if (type->baseType == NULL) {
	PERROR_INT("xmlSchemaFixupSimpleTypeStageTwo",
	    "missing baseType");
	goto exit_failure;
    }
    if (WXS_IS_TYPE_NOT_FIXED(type->baseType))
	xmlSchemaTypeFixup(type->baseType, ACTXT_CAST pctxt);
    /*
    * If a member type of a union is a union itself, we need to substitute
    * that member type for its member types.
    * NOTE that this might change in WXS 1.1; i.e. we will keep the union
    * types in WXS 1.1.
    */
    if ((type->memberTypes != NULL) &&
	(xmlSchemaFinishMemberTypeDefinitionsProperty(pctxt, type) == -1))
	return(-1);
    /*
    * SPEC src-simple-type 1
    * "The corresponding simple type definition, if any, must satisfy
    * the conditions set out in Constraints on Simple Type Definition
    * Schema Components ($3.14.6)."
    */
    /*
    * Schema Component Constraint: Simple Type Definition Properties Correct
    * (st-props-correct)
    */
    res = xmlSchemaCheckSTPropsCorrect(pctxt, type);
    HFAILURE HERROR
    /*
    * Schema Component Constraint: Derivation Valid (Restriction, Simple)
    * (cos-st-restricts)
    */
    res = xmlSchemaCheckCOSSTRestricts(pctxt, type);
    HFAILURE HERROR
    /*
    * TODO: Removed the error report, since it got annoying to get an
    * extra error report, if anything failed until now.
    * Enable this if needed.
    *
    * xmlSchemaPErr(ctxt, type->node,
    *    XML_SCHEMAP_SRC_SIMPLE_TYPE_1,
    *    "Simple type '%s' does not satisfy the constraints "
    *    "on simple type definitions.\n",
    *    type->name, NULL);
    */
    /*
    * Schema Component Constraint: Simple Type Restriction (Facets)
    * (st-restrict-facets)
    */
    res = xmlSchemaCheckFacetValues(type, pctxt);
    HFAILURE HERROR
    if ((type->facetSet != NULL) ||
	(type->baseType->facetSet != NULL)) {
	res = xmlSchemaDeriveAndValidateFacets(pctxt, type);
	HFAILURE HERROR
    }
    /*
    * Whitespace value.
    */
    res = xmlSchemaTypeFixupWhitespace(type);
    HFAILURE HERROR
    xmlSchemaTypeFixupOptimFacets(type);

exit_error:
    if (olderrs != pctxt->nberrors)
	return(pctxt->err);
    return(0);

exit_failure:
    return(-1);
}